

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gba.h
# Opt level: O3

void ClownLZSS::Internal::Gba::Decompress<std::ifstream,std::ofstream&>
               (DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *input,
               DecompressorOutput<std::basic_ofstream<char>_&> *output,uint uncompressed_size)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  
  lVar4 = std::ostream::tellp();
  cVar1 = std::istream::get();
  lVar5 = std::ostream::tellp();
  if (lVar5 - lVar4 < (long)(ulong)uncompressed_size) {
    iVar6 = 8;
    do {
      if (iVar6 == 0) {
        cVar1 = std::istream::get();
        iVar6 = 8;
      }
      uVar2 = std::istream::get();
      if (cVar1 < '\0') {
        uVar3 = std::istream::get();
        DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_4096U,_18U,_-1>::
        Copy(output,(uVar3 & 0xff) + (uVar2 & 0xf) * 0x100 + 1,((uVar2 & 0xff) >> 4) + 3);
      }
      else {
        DecompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_&,_4096U,_18U,_-1>::
        WriteImplementation(output,(uchar)uVar2);
      }
      cVar1 = cVar1 * '\x02';
      iVar6 = iVar6 + -1;
      lVar5 = std::ostream::tellp();
    } while (lVar5 - lVar4 < (long)(ulong)uncompressed_size);
  }
  return;
}

Assistant:

void Decompress(DecompressorInput<T1> &input, DecompressorOutput<T2> &output, unsigned int uncompressed_size)
			{
				const auto output_start_position = output.Tell();

				BitField<decltype(input)> descriptor_bits(input);

				while (output.Distance(output_start_position) < uncompressed_size)
				{
					if (!descriptor_bits.Pop())
					{
						// Literal
						output.Write(input.Read());
					}
					else
					{
						// Match
						const unsigned int b0 = input.Read();
						const unsigned int b1 = input.Read();
						const unsigned int count = ((b0 >> 4) & 0xf) + Decompressor::minimum_match_length;
						const unsigned int distance = (((b0 & 0xfu) << 8) | b1) + Decompressor::minimum_match_distance;
						output.Copy(distance, count);
					}
				}
			}